

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_mapper.cpp
# Opt level: O3

void __thiscall
cppcms::url_mapper::data::map
          (data *this,string_key *key,string_key *full_url,streamable **params,size_t params_no,
          map<cppcms::string_key,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *data_helpers_default,
          map<cppcms::string_key,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *data_helpers_override,ostream *out)

{
  data *this_00;
  pointer pcVar1;
  url_mapper *puVar2;
  streamable *par_ptr;
  undefined1 local_b8 [16];
  _Alloc_hider local_a8;
  char local_98 [24];
  streamable stream_url;
  stream_it<cppcms::url_mapper::data,_cppcms::url_mapper::data::entry> url;
  
  url.formatting = get_entry(this,key,params_no,full_url);
  if (this->parent == (application *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              (out,(this->root)._M_dataplus._M_p,(this->root)._M_string_length);
    write(this,(int)url.formatting,params,params_no);
  }
  else {
    url.data_helpers_override = data_helpers_override;
    url.self = this;
    url.params = params;
    url.params_no = params_no;
    url.data_helpers_default = data_helpers_default;
    filters::streamable::set
              (&stream_url,&url,
               filters::streamable::
               to_stream<cppcms::stream_it<cppcms::url_mapper::data,cppcms::url_mapper::data::entry>>
               ,filters::streamable::
                to_string<cppcms::stream_it<cppcms::url_mapper::data,cppcms::url_mapper::data::entry>>
               ,(type_info *)
                &stream_it<cppcms::url_mapper::data,cppcms::url_mapper::data::entry>::typeinfo);
    par_ptr = &stream_url;
    puVar2 = application::mapper(this->parent);
    this_00 = (puVar2->d).ptr_;
    local_b8._0_8_ = (char *)0x0;
    local_b8._8_8_ = (char *)0x0;
    pcVar1 = (this->this_name)._M_dataplus._M_p;
    local_a8._M_p = local_98;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a8,pcVar1,pcVar1 + (this->this_name)._M_string_length);
    map(this_00,(string_key *)local_b8,full_url,&par_ptr,1,data_helpers_default,
        data_helpers_override,out);
    if (local_a8._M_p != local_98) {
      operator_delete(local_a8._M_p);
    }
    filters::streamable::~streamable(&stream_url);
  }
  return;
}

Assistant:

void map(	string_key const &key,
				string_key const &full_url,
				filters::streamable const * const *params,
				size_t params_no,
				std::map<string_key,std::string> const &data_helpers_default,
				std::map<string_key,std::string> const &data_helpers_override,
				std::ostream &out) const
		{
			entry const &formatting = get_entry(key,params_no,full_url);

			if(parent) {
				stream_it<data,entry> url = 
				{ 
					this,
					&formatting,
					params,
					params_no,
					&data_helpers_default,
					&data_helpers_override
				};

				filters::streamable stream_url(url);
				filters::streamable const *par_ptr=&stream_url;
				parent->mapper().d->map(this_name,full_url,&par_ptr,1,	data_helpers_default,
											data_helpers_override,out);
			}
			else {
				out << root;
				write(formatting,params,params_no,data_helpers_default,data_helpers_override,out);
			}

		}